

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O1

int __thiscall optimization::inlineFunc::Inline_Func::init(Inline_Func *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_node_base *__v;
  _Base_ptr p_Var1;
  _Base_ptr __n;
  byte bVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *in_RAX;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var8;
  _Self __tmp;
  
  if (*(_Rb_tree_node_base **)(ctx + 0x20) != (_Rb_tree_node_base *)(ctx + 0x10)) {
    in_RAX = *(_Rb_tree_node_base **)(ctx + 0x20);
    do {
      p_Var6 = *(_Rb_tree_node_base **)(in_RAX + 6);
      if (p_Var6 != (_Rb_tree_node_base *)&in_RAX[5]._M_left) {
        __v = in_RAX + 1;
        bVar2 = 0;
        do {
          if (*(int *)&p_Var6[5]._M_left == 2) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->uninlineable_funcs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            bVar2 = 1;
            bVar3 = false;
          }
          else {
            p_Var1 = p_Var6[3]._M_left;
            for (p_Var8 = p_Var6[3]._M_parent; p_Var8 != p_Var1;
                p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
              iVar4 = (**(code **)(**(long **)p_Var8 + 8))();
              lVar7 = 0;
              if (iVar4 == 6) {
                plVar5 = *(long **)p_Var8;
                lVar7 = 0;
                if ((undefined **)*plVar5 != &PTR_display_001f0138) {
                  plVar5 = (long *)0x0;
                }
                __n = (_Base_ptr)plVar5[4];
                if (__n == in_RAX[1]._M_parent) {
                  if (__n != (_Base_ptr)0x0) {
                    iVar4 = bcmp((void *)plVar5[3],*(void **)__v,(size_t)__n);
                    if (iVar4 != 0) goto LAB_00123a7f;
                  }
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&this->uninlineable_funcs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                  lVar7 = 7;
                  bVar2 = 1;
                }
              }
LAB_00123a7f:
              if (lVar7 != 0) break;
            }
            bVar3 = (bool)(bVar2 ^ 1);
          }
          if (!bVar3) break;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)&in_RAX[5]._M_left);
      }
      in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(in_RAX);
    } while (in_RAX != (_Rb_tree_node_base *)(ctx + 0x10));
  }
  return (int)in_RAX;
}

Assistant:

void init(mir::inst::MirPackage& package) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      bool flag = false;
      for (auto& blkpair : iter->second.basic_blks) {
        if (blkpair.second.jump.jump_kind == mir::inst::JumpKind::Loop) {
          flag = true;
          uninlineable_funcs.insert(iter->first);
          break;
        }
        auto& insts = blkpair.second.inst;
        for (auto& inst : insts) {
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          if (callInst->func == iter->first) {
            uninlineable_funcs.insert(iter->first);
            flag = true;
            break;
          }
        }
        if (flag) {
          break;
        }
      }
    }
  }